

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  Segment *pSVar1;
  int iVar2;
  BlockEntry *in_RAX;
  long lVar3;
  undefined4 extraout_var;
  Cluster *this_00;
  int iVar4;
  int iVar5;
  long unaff_R12;
  bool bVar6;
  BlockEntry *pNextEntry;
  BlockEntry *local_38;
  
  pSVar1 = this->m_pSegment;
  if ((pSVar1->m_clusters == (Cluster **)0x0) || (pSVar1->m_clusterCount < 1)) {
    this_00 = &pSVar1->m_eos;
  }
  else {
    this_00 = *pSVar1->m_clusters;
  }
  if (this_00 != (Cluster *)0x0) {
    iVar4 = 0;
    local_38 = in_RAX;
    do {
      if (this_00->m_pSegment == (Segment *)0x0) {
        bVar6 = Segment::DoneParsing(this->m_pSegment);
        if (!bVar6) {
          *pBlockEntry = (BlockEntry *)0x0;
          lVar3 = -3;
          goto LAB_00860310;
        }
        break;
      }
      lVar3 = Cluster::GetFirst(this_00,pBlockEntry);
      if (lVar3 < 0) {
        iVar2 = 1;
      }
      else if (*pBlockEntry == (BlockEntry *)0x0) {
        lVar3 = unaff_R12;
        iVar5 = 3;
LAB_008602ca:
        iVar2 = iVar5;
        this_00 = Segment::GetNext(this->m_pSegment,this_00);
      }
      else {
        do {
          iVar2 = (*(*pBlockEntry)->_vptr_BlockEntry[2])();
          if ((*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) == (this->m_info).number) &&
             (iVar2 = (*this->_vptr_Track[2])(this,*pBlockEntry), (char)iVar2 != '\0')) {
            iVar2 = 1;
            lVar3 = 0;
          }
          else {
            lVar3 = Cluster::GetNext(this_00,*pBlockEntry,&local_38);
            if (lVar3 < 0) {
              iVar2 = 1;
            }
            else {
              lVar3 = unaff_R12;
              if (local_38 == (BlockEntry *)0x0) {
                iVar2 = 4;
              }
              else {
                *pBlockEntry = local_38;
                iVar2 = 0;
              }
            }
          }
          unaff_R12 = lVar3;
        } while (iVar2 == 0);
        if (iVar2 == 4) {
          iVar5 = iVar4 + 1;
          iVar2 = 2;
          bVar6 = iVar4 < 99;
          iVar4 = iVar5;
          iVar5 = 0;
          if (bVar6) goto LAB_008602ca;
        }
      }
      if ((iVar2 != 3) && (iVar2 != 0)) {
        bVar6 = iVar2 == 2;
        goto LAB_00860312;
      }
      unaff_R12 = lVar3;
    } while (this_00 != (Cluster *)0x0);
  }
  *pBlockEntry = &(this->m_eos).super_BlockEntry;
  lVar3 = 1;
LAB_00860310:
  bVar6 = false;
LAB_00860312:
  if (bVar6) {
    *pBlockEntry = &(this->m_eos).super_BlockEntry;
    lVar3 = 1;
  }
  return lVar3;
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}